

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseNull<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
           *this,EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  Ch CVar1;
  bool bVar2;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_RDI;
  ParseErrorCode in_stack_ffffffffffffff9c;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 uVar3;
  
  EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>::Take
            ((EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *)0x10ace7);
  CVar1 = EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>::Peek
                    ((EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *)0x10ad00)
  ;
  if (CVar1 == 'u') {
    EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>::Take
              ((EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *)0x10ad1d);
  }
  uVar3 = false;
  if (CVar1 == 'u') {
    CVar1 = EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>::Peek
                      ((EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *)
                       0x10ad54);
    if (CVar1 == 'l') {
      EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>::Take
                ((EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *)0x10ad71);
    }
    uVar3 = false;
    if (CVar1 == 'l') {
      CVar1 = EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>::Peek
                        ((EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *)
                         0x10ada5);
      uVar3 = CVar1 == 'l';
      if ((bool)uVar3) {
        EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>::Take
                  ((EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *)0x10adc2);
      }
    }
  }
  if ((bool)uVar3 == false) {
    EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>::Tell
              ((EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *)0x10ae48);
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                   *)CONCAT17(uVar3,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff9c,0x10ae5a);
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                   *)0x10ae66);
  }
  else {
    bVar2 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::Null(in_RDI);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>::Tell
                ((EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *)0x10ae08);
      GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
      SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                     *)CONCAT17(uVar3,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff9c,0x10ae1a)
      ;
      GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
      HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                     *)0x10ae26);
    }
  }
  return;
}

Assistant:

void ParseNull(InputStream& is, Handler& handler) {
        RAPIDJSON_ASSERT(is.Peek() == 'n');
        is.Take();

        if (RAPIDJSON_LIKELY(Consume(is, 'u') && Consume(is, 'l') && Consume(is, 'l'))) {
            if (RAPIDJSON_UNLIKELY(!handler.Null()))
                RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
        }
        else
            RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, is.Tell());
    }